

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O3

int Ivy_ObjLevelRNew(Ivy_Man_t *p,Ivy_Obj_t *pObj)

{
  int iVar1;
  Vec_Ptr_t *vArray;
  void **ppvVar2;
  long lVar3;
  int iVar4;
  
  if ((p->fFanout == 0) || (p->vRequired == (Vec_Int_t *)0x0)) {
    __assert_fail("p->fFanout && p->vRequired",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/ivy/ivyUtil.c"
                  ,0x1a6,"int Ivy_ObjLevelRNew(Ivy_Man_t *, Ivy_Obj_t *)");
  }
  vArray = (Vec_Ptr_t *)malloc(0x10);
  vArray->nCap = 10;
  vArray->nSize = 0;
  ppvVar2 = (void **)malloc(0x50);
  vArray->pArray = ppvVar2;
  Ivy_ObjCollectFanouts(p,pObj,vArray);
  ppvVar2 = vArray->pArray;
  if ((long)vArray->nSize < 1) {
    iVar4 = 999999;
    if (ppvVar2 == (void **)0x0) goto LAB_007fcee1;
  }
  else {
    iVar4 = 1000000;
    lVar3 = 0;
    do {
      if ((int *)ppvVar2[lVar3] == (int *)0x0) break;
      iVar1 = *ppvVar2[lVar3];
      if (((long)iVar1 < 0) || (p->vRequired->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar1 = p->vRequired->pArray[iVar1];
      if (iVar1 <= iVar4) {
        iVar4 = iVar1;
      }
      lVar3 = lVar3 + 1;
    } while (vArray->nSize != lVar3);
    iVar4 = iVar4 + -1;
  }
  free(ppvVar2);
LAB_007fcee1:
  free(vArray);
  return iVar4;
}

Assistant:

int Ivy_ObjLevelRNew( Ivy_Man_t * p, Ivy_Obj_t * pObj )
{
    Ivy_Obj_t * pFanout;
    Vec_Ptr_t * vFanouts;
    int i, Required, LevelNew = 1000000;
    assert( p->fFanout && p->vRequired );
    vFanouts = Vec_PtrAlloc( 10 );
    Ivy_ObjForEachFanout( p, pObj, vFanouts, pFanout, i )
    {
        Required = Vec_IntEntry(p->vRequired, pFanout->Id);
        LevelNew = IVY_MIN( LevelNew, Required );
    }
    Vec_PtrFree( vFanouts );
    return LevelNew - 1;
}